

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

int Gia_ManSimRelCollectOutputs
              (Gia_Man_t *p,int nWords,Vec_Wrd_t *vSims,int nWordsOut,Vec_Wrd_t *vSimsOut,
              Vec_Wrd_t *vRel)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iMint;
  uint local_5c;
  
  iVar1 = nWords / nWordsOut;
  if (vSims->nSize != p->nObjs * nWords) {
    __assert_fail("Vec_WrdSize(vSims) == nWords * Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x2b8,
                  "int Gia_ManSimRelCollectOutputs(Gia_Man_t *, int, Vec_Wrd_t *, int, Vec_Wrd_t *, Vec_Wrd_t *)"
                 );
  }
  if (vSimsOut->nSize == p->vCos->nSize * nWordsOut) {
    if (vRel->nSize != iVar1 * nWordsOut) {
      __assert_fail("Vec_WrdSize(vRel) == nWordsOut * nMints",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                    ,0x2ba,
                    "int Gia_ManSimRelCollectOutputs(Gia_Man_t *, int, Vec_Wrd_t *, int, Vec_Wrd_t *, Vec_Wrd_t *)"
                   );
    }
    if (0 < nWordsOut) {
      uVar3 = nWordsOut * 0x40;
      uVar6 = 1;
      if (1 < (int)uVar3) {
        uVar6 = uVar3;
      }
      iVar5 = 0;
      uVar7 = 0;
      local_5c = 0;
      do {
        uVar4 = 1;
        if (0 < iVar1) {
          iVar8 = 0;
          iMint = 0;
          do {
            iVar2 = Gia_ManSimRelCompare(p,nWords,vSims,nWordsOut,vSimsOut,local_5c,iMint);
            if (iVar2 != 0) {
              vRel->pArray[(uint)(iVar5 + iMint) >> 6] =
                   vRel->pArray[(uint)(iVar5 + iMint) >> 6] | 1L << ((byte)(iVar5 + iMint) & 0x3f);
              iVar8 = iVar8 + 1;
            }
            iMint = iMint + 1;
          } while (iVar1 != iMint);
          uVar4 = (uint)(iVar8 == 0);
        }
        uVar7 = uVar7 + uVar4;
        local_5c = local_5c + 1;
        iVar5 = iVar5 + iVar1;
      } while (local_5c != uVar6);
      if (uVar7 != 0) {
        printf("The relation is not well-defined for %d (out of %d) patterns.\n",(ulong)uVar7,
               (ulong)uVar3);
        return uVar7;
      }
    }
    return 0;
  }
  __assert_fail("Vec_WrdSize(vSimsOut) == nWordsOut * Gia_ManCoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                ,0x2b9,
                "int Gia_ManSimRelCollectOutputs(Gia_Man_t *, int, Vec_Wrd_t *, int, Vec_Wrd_t *, Vec_Wrd_t *)"
               );
}

Assistant:

int Gia_ManSimRelCollectOutputs( Gia_Man_t * p, int nWords, Vec_Wrd_t * vSims, int nWordsOut, Vec_Wrd_t * vSimsOut, Vec_Wrd_t * vRel )
{
    int i, m, nMints = nWords / nWordsOut, Count = 0;
    assert( Vec_WrdSize(vSims)    == nWords   * Gia_ManObjNum(p) );
    assert( Vec_WrdSize(vSimsOut) == nWordsOut * Gia_ManCoNum(p) );
    assert( Vec_WrdSize(vRel)     == nWordsOut * nMints );
    for ( i = 0; i < 64 * nWordsOut; i++ )
    {
        int CountMints = 0;
        for ( m = 0; m < nMints; m++ )
            if ( Gia_ManSimRelCompare(p, nWords, vSims, nWordsOut, vSimsOut, i, m) )
                Abc_TtSetBit( Vec_WrdArray(vRel), i*nMints+m ), CountMints++;
        Count += CountMints == 0;
    }
    if ( Count )
        printf( "The relation is not well-defined for %d (out of %d) patterns.\n", Count, 64 * nWordsOut );
    return Count;
}